

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

bool __thiscall
wasm::DAE::refineReturnTypes
          (DAE *this,Function *func,vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          Module *module)

{
  bool bVar1;
  reference ppCVar2;
  BasicType local_74;
  Call *local_70;
  Call *call;
  const_iterator __end3;
  const_iterator __begin3;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  Type local_48;
  Type local_40;
  Type newType;
  LUBFinder lub;
  Module *module_local;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls_local;
  Function *func_local;
  DAE *this_local;
  
  newType.id = (uintptr_t)LUB::getResultsLUB(func,module);
  bVar1 = LUBFinder::noted((LUBFinder *)&newType);
  if (bVar1) {
    local_40 = LUBFinder::getLUB((LUBFinder *)&newType);
    local_48 = Function::getResults(func);
    bVar1 = wasm::Type::operator!=(&local_40,&local_48);
    if (bVar1) {
      Function::setResults(func,local_40);
      __end3 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin(calls);
      call = (Call *)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end(calls);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                         *)&call), bVar1) {
        ppCVar2 = __gnu_cxx::
                  __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                  ::operator*(&__end3);
        local_70 = *ppCVar2;
        local_74 = unreachable;
        bVar1 = wasm::Type::operator!=
                          (&(local_70->super_SpecificExpression<(wasm::Expression::Id)6>).
                            super_Expression.type,&local_74);
        if (bVar1) {
          (local_70->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id =
               local_40.id;
        }
        __gnu_cxx::
        __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
        ::operator++(&__end3);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool refineReturnTypes(Function* func,
                         const std::vector<Call*>& calls,
                         Module* module) {
    auto lub = LUB::getResultsLUB(func, *module);
    if (!lub.noted()) {
      return false;
    }
    auto newType = lub.getLUB();
    if (newType != func->getResults()) {
      func->setResults(newType);
      for (auto* call : calls) {
        if (call->type != Type::unreachable) {
          call->type = newType;
        }
      }
      return true;
    }
    return false;
  }